

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::SchemaAttDef::setNamespaceList(SchemaAttDef *this,ValueVectorOf<unsigned_int> *toSet)

{
  ValueVectorOf<unsigned_int> *pVVar1;
  
  if ((toSet == (ValueVectorOf<unsigned_int> *)0x0) || (toSet->fCurCount == 0)) {
    pVVar1 = this->fNamespaceList;
    if ((pVVar1 != (ValueVectorOf<unsigned_int> *)0x0) && (pVVar1->fCurCount != 0)) {
      pVVar1->fCurCount = 0;
    }
  }
  else {
    if (this->fNamespaceList != (ValueVectorOf<unsigned_int> *)0x0) {
      ValueVectorOf<unsigned_int>::operator=(this->fNamespaceList,toSet);
      return;
    }
    pVVar1 = (ValueVectorOf<unsigned_int> *)
             XMemory::operator_new(0x28,(this->super_XMLAttDef).fMemoryManager);
    ValueVectorOf<unsigned_int>::ValueVectorOf(pVVar1,toSet);
    this->fNamespaceList = pVVar1;
  }
  return;
}

Assistant:

inline void SchemaAttDef::setNamespaceList(const ValueVectorOf<unsigned int>* const toSet) {

    if (toSet && toSet->size()) {

        if (fNamespaceList) {
            *fNamespaceList = *toSet;
        }
        else {
            fNamespaceList = new (getMemoryManager()) ValueVectorOf<unsigned int>(*toSet);
        }
    }
    else  {
        resetNamespaceList();
    }
}